

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
embree::OBJMaterial::OBJMaterial
          (OBJMaterial *this,float d,shared_ptr<embree::Texture> *map_d,Vec3fa *Ka,
          shared_ptr<embree::Texture> *map_Ka,Vec3fa *Kd,shared_ptr<embree::Texture> *map_Kd,
          Vec3fa *Ks,shared_ptr<embree::Texture> *map_Ks,Vec3fa *Kt,
          shared_ptr<embree::Texture> *map_Kt,float Ns,shared_ptr<embree::Texture> *map_Ns,
          shared_ptr<embree::Texture> *map_Displ)

{
  undefined8 uVar1;
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  MaterialNode *in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000018;
  string *in_stack_fffffffffffffef8;
  allocator local_a1;
  string local_a0 [36];
  undefined4 local_7c;
  undefined8 *local_70;
  undefined8 *local_60;
  undefined4 local_4c;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_7c = in_XMM1_Da;
  local_70 = in_R8;
  local_60 = in_RDX;
  local_4c = in_XMM0_Da;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"",&local_a1);
  SceneGraph::MaterialNode::MaterialNode(in_R9,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  *in_RDI = &PTR__OBJMaterial_00610590;
  Material::Material((Material *)(in_RDI + 0xe),MATERIAL_OBJ);
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)((long)in_RDI + 0x84) = local_4c;
  *(undefined4 *)(in_RDI + 0x11) = local_7c;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0x3f800000;
  local_38 = in_RDI + 0x12;
  local_40 = local_60;
  uVar1 = local_60[1];
  *local_38 = *local_60;
  in_RDI[0x13] = uVar1;
  local_28 = in_RDI + 0x14;
  local_30 = local_70;
  uVar1 = local_70[1];
  *local_28 = *local_70;
  in_RDI[0x15] = uVar1;
  local_18 = in_RDI + 0x16;
  uVar1 = in_stack_00000008[1];
  *local_18 = *in_stack_00000008;
  in_RDI[0x17] = uVar1;
  local_8 = in_RDI + 0x18;
  local_10 = in_stack_00000018;
  uVar1 = in_stack_00000018[1];
  *local_8 = *in_stack_00000018;
  in_RDI[0x19] = uVar1;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_R9,
             (shared_ptr<embree::Texture> *)in_stack_fffffffffffffef8);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_R9,
             (shared_ptr<embree::Texture> *)in_stack_fffffffffffffef8);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_R9,
             (shared_ptr<embree::Texture> *)in_stack_fffffffffffffef8);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_R9,
             (shared_ptr<embree::Texture> *)in_stack_fffffffffffffef8);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_R9,
             (shared_ptr<embree::Texture> *)in_stack_fffffffffffffef8);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_R9,
             (shared_ptr<embree::Texture> *)in_stack_fffffffffffffef8);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_R9,
             (shared_ptr<embree::Texture> *)in_stack_fffffffffffffef8);
  return;
}

Assistant:

OBJMaterial (float d, const std::shared_ptr<Texture> map_d,
                 const Vec3fa& Ka, const std::shared_ptr<Texture> map_Ka, 
                 const Vec3fa& Kd, const std::shared_ptr<Texture> map_Kd, 
                 const Vec3fa& Ks, const std::shared_ptr<Texture> map_Ks,
                 const Vec3fa& Kt, const std::shared_ptr<Texture> map_Kt, 
                 const float Ns, const std::shared_ptr<Texture> map_Ns, 
                 const std::shared_ptr<Texture> map_Displ)
      : base(MATERIAL_OBJ), illum(0), d(d), Ns(Ns), Ni(1.f), Ka(Ka), Kd(Kd), Ks(Ks), Kt(Kt), 
      map_d(nullptr), map_Ka(nullptr), map_Kd(nullptr), map_Ks(nullptr), map_Kt(nullptr), map_Ns(nullptr), map_Displ(nullptr),
      _map_d(map_d), _map_Ka(map_Ka), _map_Kd(map_Kd), _map_Ks(map_Ks), _map_Kt(map_Kt), _map_Ns(map_Ns), _map_Displ(map_Displ) {}